

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O0

void __thiscall E64::stats_t::reset(stats_t *this)

{
  undefined8 uVar1;
  undefined8 *in_RDI;
  
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  *(undefined1 *)(in_RDI + 5) = 0;
  *(undefined1 *)((long)in_RDI + 0x29) = 8;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b) = 0x1e;
  in_RDI[0xc] = 0x40c0000000000000;
  in_RDI[8] = 0x404e000000000000;
  in_RDI[10] = 0x4026000000000000;
  in_RDI[0xe] = 0x40c0468000000000;
  in_RDI[0x10] = 0;
  in_RDI[6] = 0x3fecccccc0000000;
  *(undefined4 *)(in_RDI + 0x31) = 0x411a;
  uVar1 = std::chrono::_V2::steady_clock::now();
  in_RDI[1] = uVar1;
  *in_RDI = in_RDI[1];
  return;
}

Assistant:

void E64::stats_t::reset()
{
    total_time = 0;
    total_idle_time = 0;
    
    framecounter = 0;
    framecounter_interval = 8;
    
    status_bar_framecounter = 0;
    status_bar_framecounter_interval = FPS / 2;

    smoothed_audio_queue_size = AUDIO_BUFFER_SIZE;
    
    smoothed_framerate = FPS;
    
    smoothed_mhz = CPU_CLOCK_SPEED/(1000*1000);
    
    smoothed_idle_per_frame = 1000000 / (FPS * 2);
    
    smoothed_percentage_blitter = 0;
    
    alpha = 0.90f;
    
    frametime = 1000000 / FPS;

    now = then = std::chrono::steady_clock::now();
}